

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O2

int compareWords2(void **x,void **y)

{
  int iVar1;
  
  iVar1 = 1;
  if (**x <= **y) {
    iVar1 = -(uint)(**x < **y);
  }
  return iVar1;
}

Assistant:

int compareWords2 (const void ** x, const void ** y)
{
    
    if(**(word**)x > **(word**)y)
        return 1;
    else if(**(word**)x < **(word**)y)
        return -1;
    else
        return 0;   
    
}